

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O3

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *unaff_RBX;
  nn_fsm *self_00;
  
  if (self->state == 3) {
    unaff_RBX = self;
    if (src == 0x6c41) {
      if (type != 5) {
        if (*(int *)&self[1].fn != 6) goto LAB_00129afe;
        if (type != 6) {
          self_00 = (nn_fsm *)(ulong)(uint)type;
          nn_sinproc_shutdown_cold_2();
          nn_list_item_term((nn_list_item *)&self_00[7].srcptr);
          nn_fsm_event_term((nn_fsm_event *)&self_00[6].stopped.type);
          nn_fsm_event_term((nn_fsm_event *)&self_00[6].owner);
          nn_fsm_event_term((nn_fsm_event *)&self_00[5].stopped.item);
          nn_fsm_event_term((nn_fsm_event *)&self_00[5].ctx);
          nn_msg_term((nn_msg *)&self_00[4].owner);
          nn_msgqueue_term((nn_msgqueue *)&self_00[3].stopped.src);
          nn_pipebase_term((nn_pipebase *)&self_00[1].state);
          nn_fsm_term(self_00);
          return;
        }
LAB_00129a7a:
        *(undefined4 *)&self[1].fn = 7;
      }
LAB_00129a81:
      if (*(int *)&self[1].fn != 7) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
      if (iVar1 != 0) goto LAB_00129adc;
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
      if (iVar1 == 0) {
        nn_fsm_stopped(self,7);
        return;
      }
      goto LAB_00129ae1;
    }
    if (src == -2) {
      if (type == 5) goto LAB_00129a81;
      if (type != -3) goto LAB_00129aeb;
      if ((*(uint *)&self[1].fn | 4) == 5) goto LAB_00129a7a;
      nn_pipebase_stop((nn_pipebase *)&self[1].state);
      if (0xfffffffd < self->state - 4U) {
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 6;
        goto LAB_00129a81;
      }
      goto LAB_00129ae6;
    }
  }
  else {
    nn_sinproc_shutdown_cold_1();
LAB_00129adc:
    nn_sinproc_shutdown_cold_3();
LAB_00129ae1:
    nn_sinproc_shutdown_cold_4();
LAB_00129ae6:
    nn_sinproc_shutdown_cold_5();
  }
LAB_00129aeb:
  if (*(int *)&unaff_RBX[1].fn == 6) {
    nn_sinproc_shutdown_cold_6();
  }
LAB_00129afe:
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state");
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}